

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O0

void uset_addString_63(USet *set,UChar *str,int32_t strLen)

{
  ConstChar16Ptr local_68;
  undefined1 local_60 [8];
  UnicodeString s;
  int32_t strLen_local;
  UChar *str_local;
  USet *set_local;
  
  s.fUnion._52_4_ = strLen;
  icu_63::ConstChar16Ptr::ConstChar16Ptr(&local_68,str);
  icu_63::UnicodeString::UnicodeString
            ((UnicodeString *)local_60,(byte)((uint)strLen >> 0x1f),&local_68,s.fUnion._52_4_);
  icu_63::ConstChar16Ptr::~ConstChar16Ptr(&local_68);
  icu_63::UnicodeSet::add((UnicodeSet *)set,(UnicodeString *)local_60);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_60);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uset_addString(USet* set, const UChar* str, int32_t strLen) {
    // UnicodeString handles -1 for strLen
    UnicodeString s(strLen<0, str, strLen);
    ((UnicodeSet*) set)->UnicodeSet::add(s);
}